

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void fits_free_region(SAORegion *Rgn)

{
  void *__ptr;
  bool bVar1;
  bool bVar2;
  int *in_RDI;
  int isAlreadyFreed;
  double *ptsToFree;
  double **freedPolyPtrs;
  int nPolyArraySize;
  int nFreedPoly;
  int j;
  int i;
  void *local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = 0;
  local_18 = 10;
  local_20 = malloc(0x50);
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    if (*(int *)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8 + 4) == 0xb) {
      if (*(char *)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8) == '\0') {
        __ptr = *(void **)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8 + 0x38);
        bVar2 = false;
        local_10 = 0;
        while( true ) {
          bVar1 = false;
          if (local_10 < local_14) {
            bVar1 = (bool)(bVar2 ^ 1);
          }
          if (!bVar1) break;
          if (*(void **)((long)local_20 + (long)local_10 * 8) == __ptr) {
            bVar2 = true;
          }
          local_10 = local_10 + 1;
        }
        if (!bVar2) {
          free(__ptr);
          if (local_14 == local_18) {
            local_18 = local_18 << 1;
            local_20 = realloc(local_20,(long)local_18 << 3);
          }
          *(void **)((long)local_20 + (long)local_14 * 8) = __ptr;
          local_14 = local_14 + 1;
        }
      }
      else {
        free(*(void **)(*(long *)(in_RDI + 2) + (long)local_c * 0xa8 + 0x38));
      }
    }
  }
  if (*(long *)(in_RDI + 2) != 0) {
    free(*(void **)(in_RDI + 2));
  }
  free(in_RDI);
  free(local_20);
  return;
}

Assistant:

void fits_free_region( SAORegion *Rgn )
/*   Free up memory allocated to hold the region data.                       
   This is more complicated for the case of polygons, which may be sharing
   points arrays due to shallow copying (in fits_set_region_components) of
   'exluded' regions.  We must ensure that these arrays are only freed once.       

/*---------------------------------------------------------------------------*/
{
   int i,j;
   
   int nFreedPoly=0;
   int nPolyArraySize=10;
   double **freedPolyPtrs=0;
   double *ptsToFree=0;
   int isAlreadyFreed=0;
   
   freedPolyPtrs = (double**)malloc(nPolyArraySize*sizeof(double*));

   for( i=0; i<Rgn->nShapes; i++ )
      if( Rgn->Shapes[i].shape == poly_rgn )
      {
         /* No shared arrays for 'include' polygons */
         if (Rgn->Shapes[i].sign)
            free(Rgn->Shapes[i].param.poly.Pts);
         else
         {
            ptsToFree = Rgn->Shapes[i].param.poly.Pts;
            isAlreadyFreed = 0;
            for (j=0; j<nFreedPoly && !isAlreadyFreed; j++)
            {
               if (freedPolyPtrs[j] == ptsToFree)
                  isAlreadyFreed = 1;
            }
            if (!isAlreadyFreed)
            {
               free(ptsToFree);
               /* Now add pointer to array of freed points */
               if (nFreedPoly == nPolyArraySize)
               {
                  nPolyArraySize *= 2;
                  freedPolyPtrs = (double **)realloc(freedPolyPtrs, 
                          nPolyArraySize*sizeof(double*));
               }
               freedPolyPtrs[nFreedPoly] = ptsToFree;
               ++nFreedPoly;
            }
         }
      }
   if( Rgn->Shapes )
      free( Rgn->Shapes );
   free( Rgn );
   
   free(freedPolyPtrs);
}